

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O2

void audit_regressor(audit_regressor_data *rd,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  features *pfVar2;
  byte bVar3;
  uint64_t uVar4;
  float *pfVar5;
  vw *pvVar6;
  size_t j;
  ulong uVar7;
  byte *pbVar8;
  size_t j_1;
  long lVar9;
  
  if (rd->all->lda != 0) {
    audit_regressor_lda(rd,base,ec);
    return;
  }
  rd->cur_class = 0;
  uVar4 = (ec->super_example_predict).ft_offset;
  uVar7 = 0;
  while (uVar7 < rd->total_class_cnt) {
    for (pbVar8 = (ec->super_example_predict).indices._begin;
        pbVar8 != (ec->super_example_predict).indices._end; pbVar8 = pbVar8 + 1) {
      bVar3 = *pbVar8;
      pfVar2 = (ec->super_example_predict).feature_space + bVar3;
      if ((ec->super_example_predict).feature_space[bVar3].space_names._end ==
          (ec->super_example_predict).feature_space[bVar3].space_names._begin) {
        for (uVar7 = 0; pfVar5 = (pfVar2->values)._begin,
            uVar7 < (ulong)((long)(pfVar2->values)._end - (long)pfVar5 >> 2); uVar7 = uVar7 + 1) {
          audit_regressor_feature
                    (rd,pfVar5[uVar7],
                     (ulong)(uint)(pfVar2->indicies)._begin[uVar7] +
                     (ec->super_example_predict).ft_offset);
        }
      }
      else {
        lVar9 = 0;
        for (uVar7 = 0;
            uVar7 < (ulong)((long)(pfVar2->values)._end - (long)(pfVar2->values)._begin >> 2);
            uVar7 = uVar7 + 1) {
          audit_regressor_interaction
                    (rd,*(audit_strings **)
                         ((long)&(((pfVar2->space_names)._begin)->
                                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + lVar9 * 2));
          audit_regressor_feature
                    (rd,(pfVar2->values)._begin[uVar7],
                     (ulong)*(uint *)((long)(pfVar2->indicies)._begin + lVar9) +
                     (ec->super_example_predict).ft_offset);
          audit_regressor_interaction(rd,(audit_strings *)0x0);
          lVar9 = lVar9 + 8;
        }
      }
    }
    pvVar6 = rd->all;
    if ((pvVar6->weights).sparse == false) {
      INTERACTIONS::
      generate_interactions<audit_regressor_data,_const_unsigned_long,_&audit_regressor_feature,_true,_&audit_regressor_interaction,_dense_parameters>
                (&pvVar6->interactions,pvVar6->permutations,&ec->super_example_predict,rd,
                 &(pvVar6->weights).dense_weights);
    }
    else {
      INTERACTIONS::
      generate_interactions<audit_regressor_data,_const_unsigned_long,_&audit_regressor_feature,_true,_&audit_regressor_interaction,_sparse_parameters>
                (&pvVar6->interactions,pvVar6->permutations,&ec->super_example_predict,rd,
                 &(pvVar6->weights).sparse_weights);
    }
    puVar1 = &(ec->super_example_predict).ft_offset;
    *puVar1 = *puVar1 + rd->increment;
    uVar7 = rd->cur_class + 1;
    rd->cur_class = uVar7;
  }
  (ec->super_example_predict).ft_offset = uVar4;
  return;
}

Assistant:

void audit_regressor(audit_regressor_data& rd, LEARNER::single_learner& base, example& ec)
{
  vw& all = *rd.all;

  if (all.lda > 0)
    audit_regressor_lda(rd, base, ec);
  else
  {
    rd.cur_class = 0;
    uint64_t old_offset = ec.ft_offset;

    while (rd.cur_class < rd.total_class_cnt)
    {
      for (unsigned char* i = ec.indices.begin(); i != ec.indices.end(); ++i)
      {
        features& fs = ec.feature_space[(size_t)*i];
        if (fs.space_names.size() > 0)
          for (size_t j = 0; j < fs.size(); ++j)
          {
            audit_regressor_interaction(rd, fs.space_names[j].get());
            audit_regressor_feature(rd, fs.values[j], (uint32_t)fs.indicies[j] + ec.ft_offset);
            audit_regressor_interaction(rd, NULL);
          }
        else
          for (size_t j = 0; j < fs.size(); ++j)
            audit_regressor_feature(rd, fs.values[j], (uint32_t)fs.indicies[j] + ec.ft_offset);
      }

      if (rd.all->weights.sparse)
        INTERACTIONS::generate_interactions<audit_regressor_data, const uint64_t, audit_regressor_feature, true,
            audit_regressor_interaction, sparse_parameters>(
            rd.all->interactions, rd.all->permutations, ec, rd, rd.all->weights.sparse_weights);
      else
        INTERACTIONS::generate_interactions<audit_regressor_data, const uint64_t, audit_regressor_feature, true,
            audit_regressor_interaction, dense_parameters>(
            rd.all->interactions, rd.all->permutations, ec, rd, rd.all->weights.dense_weights);

      ec.ft_offset += rd.increment;
      ++rd.cur_class;
    }

    ec.ft_offset = old_offset;  // make sure example is not changed.
  }
}